

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int ddEpdCountMintermAux(DdNode *node,EpDouble *max,EpDouble *epd,st__table *table)

{
  DdNode *pDVar1;
  int iVar2;
  EpDouble *to;
  EpDouble *pEStack_70;
  int status;
  EpDouble *res;
  EpDouble minE;
  EpDouble minT;
  EpDouble *min;
  DdNode *Ne;
  DdNode *Nt;
  st__table *table_local;
  EpDouble *epd_local;
  EpDouble *max_local;
  DdNode *node_local;
  
  if (node->index == 0x7fffffff) {
    if ((node == background) || (node == zero)) {
      EpdMakeZero(epd,0);
    }
    else {
      EpdCopy(max,epd);
    }
    node_local._4_4_ = 0;
  }
  else if ((node->ref == 1) ||
          (iVar2 = st__lookup(table,(char *)node,(char **)&stack0xffffffffffffff90), iVar2 == 0)) {
    pDVar1 = (node->type).kids.E;
    iVar2 = ddEpdCountMintermAux((node->type).kids.T,max,(EpDouble *)&minE.exponent,table);
    if (iVar2 == -1) {
      node_local._4_4_ = -1;
    }
    else {
      EpdMultiply((EpDouble *)&minE.exponent,0.5);
      iVar2 = ddEpdCountMintermAux
                        ((DdNode *)((ulong)pDVar1 & 0xfffffffffffffffe),max,(EpDouble *)&res,table);
      if (iVar2 == -1) {
        node_local._4_4_ = -1;
      }
      else {
        if (((ulong)pDVar1 & 1) != 0) {
          EpdSubtract3(max,(EpDouble *)&res,epd);
          EpdCopy(epd,(EpDouble *)&res);
        }
        EpdMultiply((EpDouble *)&res,0.5);
        EpdAdd3((EpDouble *)&minE.exponent,(EpDouble *)&res,epd);
        if (1 < node->ref) {
          to = EpdAlloc();
          if (to == (EpDouble *)0x0) {
            return -1;
          }
          EpdCopy(epd,to);
          iVar2 = st__insert(table,(char *)node,(char *)to);
          if (iVar2 == -10000) {
            EpdFree(to);
            return -1;
          }
        }
        node_local._4_4_ = 0;
      }
    }
  }
  else {
    EpdCopy(pEStack_70,epd);
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

static int
ddEpdCountMintermAux(
  DdNode * node,
  EpDouble * max,
  EpDouble * epd,
  st__table * table)
{
    DdNode      *Nt, *Ne;
    EpDouble    *min, minT, minE;
    EpDouble    *res;
    int         status;

    /* node is assumed to be regular */
    if (cuddIsConstant(node)) {
        if (node == background || node == zero) {
            EpdMakeZero(epd, 0);
        } else {
            EpdCopy(max, epd);
        }
        return(0);
    }
    if (node->ref != 1 && st__lookup(table, (const char *)node, (char **)&res)) {
        EpdCopy(res, epd);
        return(0);
    }

    Nt = cuddT(node); Ne = cuddE(node);

    status = ddEpdCountMintermAux(Nt,max,&minT,table);
    if (status == CUDD_OUT_OF_MEM) return(CUDD_OUT_OF_MEM);
    EpdMultiply(&minT, (double)0.5);
    status = ddEpdCountMintermAux(Cudd_Regular(Ne),max,&minE,table);
    if (status == CUDD_OUT_OF_MEM) return(CUDD_OUT_OF_MEM);
    if (Cudd_IsComplement(Ne)) {
        EpdSubtract3(max, &minE, epd);
        EpdCopy(epd, &minE);
    }
    EpdMultiply(&minE, (double)0.5);
    EpdAdd3(&minT, &minE, epd);

    if (node->ref > 1) {
        min = EpdAlloc();
        if (!min)
            return(CUDD_OUT_OF_MEM);
        EpdCopy(epd, min);
        if ( st__insert(table, (char *)node, (char *)min) == st__OUT_OF_MEM) {
            EpdFree(min);
            return(CUDD_OUT_OF_MEM);
        }
    }

    return(0);

}